

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int eval_preprocessor_boolean(char *z,int lineno)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  char **ppcVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ushort **ppuVar11;
  long lVar12;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  
  bVar4 = true;
  bVar5 = false;
  uVar10 = 0;
  uVar14 = 0;
  do {
    lVar20 = (long)(int)uVar14;
    bVar1 = z[lVar20];
    uVar16 = (ulong)bVar1;
    if (uVar16 == 0) {
      return uVar10;
    }
    ppuVar11 = __ctype_b_loc();
    ppcVar7 = azDefine;
    uVar3 = (*ppuVar11)[uVar16];
    if ((uVar3 >> 0xd & 1) == 0) {
      if (uVar16 == 0x7c) {
        if (z[lVar20 + 1] == '|') {
          if (bVar4) goto LAB_0010b567;
          if (uVar10 != 0) {
            return 1;
          }
          uVar10 = 0;
LAB_0010b458:
          uVar14 = uVar14 + 1;
          bVar4 = true;
        }
        else {
LAB_0010b46a:
          if (((uVar3 >> 10 & 1) == 0) || (!bVar4)) {
LAB_0010b567:
            if (lineno < 1) {
              return ~uVar14;
            }
            fprintf(_stderr,"%%if syntax error on line %d.\n");
            fprintf(_stderr,"  %.*s <-- syntax error here\n",(ulong)(uVar14 + 1),z);
            exit(1);
          }
          lVar12 = 0;
          do {
            do {
              lVar6 = lVar12 + lVar20 + 1;
              lVar12 = lVar12 + 1;
            } while (z[lVar6] == 0x5f);
          } while (((*ppuVar11)[(byte)z[lVar6]] & 8) != 0);
          iVar8 = (int)lVar12;
          lVar12 = (long)nDefine;
          uVar16 = 0;
          if (0 < nDefine) {
            uVar16 = (ulong)(uint)nDefine;
          }
          for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
            pcVar13 = ppcVar7[uVar15];
            iVar9 = strncmp(pcVar13,z + lVar20,(long)iVar8);
            if ((iVar9 == 0) && (pcVar13[iVar8] == '\0')) {
              uVar18 = 1;
              goto LAB_0010b503;
            }
          }
          uVar18 = 0;
LAB_0010b503:
          uVar10 = (uint)(lVar12 <= (long)uVar15);
          if (!bVar5) {
            uVar10 = uVar18;
          }
          bVar4 = false;
          uVar14 = (uVar14 - 1) + iVar8;
          bVar5 = false;
        }
      }
      else {
        if (bVar1 == 0x26) {
          if (z[lVar20 + 1] == '&') {
            if (bVar4) goto LAB_0010b567;
            if (uVar10 == 0) {
              return 0;
            }
            goto LAB_0010b458;
          }
          goto LAB_0010b46a;
        }
        if (bVar1 == 0x28) {
          if (!bVar4) goto LAB_0010b567;
          uVar17 = uVar14 + 1;
          pcVar13 = z + (int)uVar17;
          iVar8 = 1;
          uVar18 = uVar17;
LAB_0010b40f:
          cVar2 = *pcVar13;
          if (cVar2 == '(') {
            iVar8 = iVar8 + 1;
LAB_0010b430:
            pcVar13 = pcVar13 + 1;
            uVar18 = uVar18 + 1;
            goto LAB_0010b40f;
          }
          if (cVar2 != ')') {
            uVar19 = uVar14;
            if (cVar2 == '\0') goto LAB_0010b543;
            goto LAB_0010b430;
          }
          iVar8 = iVar8 + -1;
          if (iVar8 != 0) goto LAB_0010b430;
          *pcVar13 = '\0';
          uVar10 = eval_preprocessor_boolean(z + (int)uVar17,-1);
          *pcVar13 = ')';
          uVar19 = uVar18;
          if ((int)uVar10 < 0) {
            uVar14 = uVar14 - uVar10;
            goto LAB_0010b567;
          }
LAB_0010b543:
          if (bVar5) {
            uVar10 = (uint)(uVar10 == 0);
          }
          bVar5 = false;
          bVar4 = false;
          uVar14 = uVar19;
        }
        else {
          if (bVar1 != 0x21) goto LAB_0010b46a;
          if (!bVar4) goto LAB_0010b567;
          bVar4 = true;
          bVar5 = !bVar5;
        }
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

static int eval_preprocessor_boolean(char *z, int lineno){
  int neg = 0;
  int res = 0;
  int okTerm = 1;
  int i;
  for(i=0; z[i]!=0; i++){
    if( ISSPACE(z[i]) ) continue;
    if( z[i]=='!' ){
      if( !okTerm ) goto pp_syntax_error;
      neg = !neg;
      continue;
    }
    if( z[i]=='|' && z[i+1]=='|' ){
      if( okTerm ) goto pp_syntax_error;
      if( res ) return 1;
      i++;
      okTerm = 1;
      continue;
    }
    if( z[i]=='&' && z[i+1]=='&' ){
      if( okTerm ) goto pp_syntax_error;
      if( !res ) return 0;
      i++;
      okTerm = 1;
      continue;
    }
    if( z[i]=='(' ){
      int k;
      int n = 1;
      if( !okTerm ) goto pp_syntax_error;
      for(k=i+1; z[k]; k++){
        if( z[k]==')' ){
          n--;
          if( n==0 ){
            z[k] = 0;
            res = eval_preprocessor_boolean(&z[i+1], -1);
            z[k] = ')';
            if( res<0 ){
              i = i-res;
              goto pp_syntax_error;
            }
            i = k;
            break;
          }
        }else if( z[k]=='(' ){
          n++;
        }else if( z[k]==0 ){
          i = k;
          goto pp_syntax_error;
        }
      }
      if( neg ){
        res = !res;
        neg = 0;
      }
      okTerm = 0;
      continue;
    }
    if( ISALPHA(z[i]) ){
      int j, k, n;
      if( !okTerm ) goto pp_syntax_error;
      for(k=i+1; ISALNUM(z[k]) || z[k]=='_'; k++){}
      n = k - i;
      res = 0;
      for(j=0; j<nDefine; j++){
        if( strncmp(azDefine[j],&z[i],n)==0 && azDefine[j][n]==0 ){
          res = 1;
          break;
        }
      }
      i = k-1;
      if( neg ){
        res = !res;
        neg = 0;
      }
      okTerm = 0;
      continue;
    }
    goto pp_syntax_error;
  }
  return res;

pp_syntax_error:
  if( lineno>0 ){
    fprintf(stderr, "%%if syntax error on line %d.\n", lineno);
    fprintf(stderr, "  %.*s <-- syntax error here\n", i+1, z);
    exit(1);
  }else{
    return -(i+1);
  }
}